

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O2

void __thiscall
Fl_Tree_Item_Array::Fl_Tree_Item_Array(Fl_Tree_Item_Array *this,Fl_Tree_Item_Array *o)

{
  int iVar1;
  Fl_Tree_Item **ppFVar2;
  Fl_Tree_Item *this_00;
  long lVar3;
  
  iVar1 = o->_size;
  ppFVar2 = (Fl_Tree_Item **)malloc((long)iVar1 << 3);
  this->_items = ppFVar2;
  this->_total = 0;
  this->_size = iVar1;
  this->_chunksize = o->_chunksize;
  for (lVar3 = 0; lVar3 < o->_total; lVar3 = lVar3 + 1) {
    this_00 = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item::Fl_Tree_Item(this_00,o->_items[lVar3]);
    this->_items[lVar3] = this_00;
    this->_total = this->_total + 1;
    Fl_Tree_Item::update_prev_next(this->_items[lVar3],(int)lVar3);
  }
  return;
}

Assistant:

Fl_Tree_Item_Array::Fl_Tree_Item_Array(const Fl_Tree_Item_Array* o) {
  _items = (Fl_Tree_Item**)malloc(o->_size * sizeof(Fl_Tree_Item*));
  _total     = 0;
  _size      = o->_size;
  _chunksize = o->_chunksize;
#if FLTK_ABI_VERSION >= 10303
  _flags     = o->_flags;
#endif
  for ( int t=0; t<o->_total; t++ ) {
#if FLTK_ABI_VERSION >= 10303
    if ( _flags & MANAGE_ITEM ) {
      _items[t] = new Fl_Tree_Item(o->_items[t]);	// make new copy of item
      ++_total;
      _items[t]->update_prev_next(t);			// update uses _total's current value
    } else {
      _items[t] = o->_items[t];				// copy ptr only
      ++_total;
    }
#else
    _items[t] = new Fl_Tree_Item(o->_items[t]);		// make new copy of item
    ++_total;
    _items[t]->update_prev_next(t);			// update uses _total's current value
#endif
  }
}